

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O1

int erkStep_ComputeSolutions(ARKodeMem ark_mem,realtype *dsmPtr)

{
  void *pvVar1;
  N_Vector z;
  N_Vector z_00;
  realtype *c;
  N_Vector *X;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  realtype rVar6;
  
  pvVar1 = ark_mem->step_mem;
  if (pvVar1 == (void *)0x0) {
    iVar3 = -0x15;
    arkProcessError(ark_mem,-0x15,"ARKode::ERKStep","erkStep_ComputeSolutions",
                    "Time step module memory is NULL.");
  }
  else {
    z = ark_mem->ycur;
    z_00 = ark_mem->tempv1;
    c = *(realtype **)((long)pvVar1 + 0x30);
    X = *(N_Vector **)((long)pvVar1 + 0x38);
    *dsmPtr = 0.0;
    iVar3 = *(int *)((long)pvVar1 + 0x18);
    uVar4 = 0;
    if (0 < (long)iVar3) {
      do {
        c[uVar4] = ark_mem->h *
                   *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + uVar4 * 8);
        X[uVar4] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while ((long)iVar3 != uVar4);
    }
    c[uVar4 & 0xffffffff] = 1.0;
    X[uVar4 & 0xffffffff] = ark_mem->yn;
    iVar2 = N_VLinearCombination((int)uVar4 + 1,c,X,z);
    iVar3 = -0x1c;
    if ((iVar2 == 0) && (iVar3 = 0, ark_mem->fixedstep == 0)) {
      iVar3 = *(int *)((long)pvVar1 + 0x18);
      lVar5 = 0;
      if (0 < (long)iVar3) {
        do {
          c[lVar5] = (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x20) + lVar5 * 8) -
                     *(double *)(*(long *)(*(long *)((long)pvVar1 + 0x20) + 0x28) + lVar5 * 8)) *
                     ark_mem->h;
          X[lVar5] = *(N_Vector *)(*(long *)((long)pvVar1 + 8) + lVar5 * 8);
          lVar5 = lVar5 + 1;
        } while (iVar3 != lVar5);
      }
      iVar2 = N_VLinearCombination((int)lVar5,c,X,z_00);
      iVar3 = -0x1c;
      if (iVar2 == 0) {
        rVar6 = N_VWrmsNorm(z_00,ark_mem->ewt);
        *dsmPtr = rVar6;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int erkStep_ComputeSolutions(ARKodeMem ark_mem, realtype *dsmPtr)
{
  /* local data */
  int retval, j, nvec;
  N_Vector y, yerr;
  realtype* cvals;
  N_Vector* Xvecs;
  ARKodeERKStepMem step_mem;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem==NULL) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ERKStep",
                    "erkStep_ComputeSolutions", MSG_ERKSTEP_NO_MEM);
    return(ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem) ark_mem->step_mem;

  /* set N_Vector shortcuts */
  y    = ark_mem->ycur;
  yerr = ark_mem->tempv1;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* initialize output */
  *dsmPtr = ZERO;


  /* Compute time step solution */
  /*   set arrays for fused vector operation */
  nvec = 0;
  for (j=0; j<step_mem->stages; j++) {
    cvals[nvec] = ark_mem->h * step_mem->B->b[j];
    Xvecs[nvec] = step_mem->F[j];
    nvec += 1;
  }
  cvals[nvec] = ONE;
  Xvecs[nvec] = ark_mem->yn;
  nvec += 1;

  /*   call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, y);
  if (retval != 0) return(ARK_VECTOROP_ERR);

  /* Compute yerr (if step adaptivity enabled) */
  if (!ark_mem->fixedstep) {

    /* set arrays for fused vector operation */
    nvec = 0;
    for (j=0; j<step_mem->stages; j++) {
      cvals[nvec] = ark_mem->h * (step_mem->B->b[j] - step_mem->B->d[j]);
      Xvecs[nvec] = step_mem->F[j];
      nvec += 1;
    }

    /* call fused vector operation to do the work */
    retval = N_VLinearCombination(nvec, cvals, Xvecs, yerr);
    if (retval != 0) return(ARK_VECTOROP_ERR);

    /* fill error norm */
    *dsmPtr = N_VWrmsNorm(yerr, ark_mem->ewt);
  }

  return(ARK_SUCCESS);
}